

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O2

big_integer * anon_unknown.dwarf_afea::rand_big(big_integer *__return_storage_ptr__,size_t size)

{
  int iVar1;
  bool bVar2;
  big_integer bStack_38;
  
  iVar1 = rand();
  big_integer::big_integer(__return_storage_ptr__,iVar1);
  while (bVar2 = size != 0, size = size - 1, bVar2) {
    big_integer::big_integer(&bStack_38,0x7fffffff);
    big_integer::operator*=(__return_storage_ptr__,&bStack_38);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&bStack_38);
    iVar1 = rand();
    big_integer::big_integer(&bStack_38,iVar1);
    big_integer::operator+=(__return_storage_ptr__,&bStack_38);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&bStack_38);
  }
  return __return_storage_ptr__;
}

Assistant:

big_integer rand_big(size_t size) {
        big_integer result = rand();

        for (size_t i = 0; i != size; ++i) {
            result *= RAND_MAX;
            result += rand();
        }

        return result;
    }